

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * saferealloc(void *ptr,size_t n,size_t size)

{
  undefined1 auVar1 [16];
  void *local_28;
  void *p;
  size_t size_local;
  size_t n_local;
  void *ptr_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar1,0) < n) {
    local_28 = (void *)0x0;
  }
  else if (ptr == (void *)0x0) {
    local_28 = malloc(n * size);
  }
  else {
    local_28 = realloc(ptr,n * size);
  }
  if (local_28 != (void *)0x0) {
    return local_28;
  }
  out_of_memory();
}

Assistant:

void *saferealloc(void *ptr, size_t n, size_t size)
{
    void *p;

    if (n > INT_MAX / size) {
        p = NULL;
    } else {
        size *= n;
        if (!ptr) {
#ifdef MINEFIELD
            p = minefield_c_malloc(size);
#else
            p = malloc(size);
#endif
        } else {
#ifdef MINEFIELD
            p = minefield_c_realloc(ptr, size);
#else
            p = realloc(ptr, size);
#endif
        }
    }

    if (!p)
        out_of_memory();

    return p;
}